

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::standard_value<bool>::set_default_and_implicit(standard_value<bool> *this)

{
  standard_value<bool> *this_local;
  
  (this->super_abstract_value<bool>).m_default = true;
  std::__cxx11::string::operator=
            ((string *)&(this->super_abstract_value<bool>).m_default_value,"false");
  (this->super_abstract_value<bool>).m_implicit = true;
  std::__cxx11::string::operator=
            ((string *)&(this->super_abstract_value<bool>).m_implicit_value,"true");
  return;
}

Assistant:

void
      set_default_and_implicit()
      {
        m_default = true;
        m_default_value = "false";
        m_implicit = true;
        m_implicit_value = "true";
      }